

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O2

bool __thiscall ON_AngleValue::Write(ON_AngleValue *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = ON_BinaryArchive::BeginWrite3dmAnonymousChunk(archive,1);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::WriteDouble(archive,this->m_angle);
    if ((((bVar1) &&
         (bVar1 = ON_BinaryArchive::WriteInt(archive,(uint)this->m_angle_unit_system), bVar1)) &&
        (bVar1 = ON_BinaryArchive::WriteInt(archive,(uint)this->m_context_length_unit_system), bVar1
        )) && ((bVar1 = ON_BinaryArchive::WriteInt(archive,this->m_context_locale_id), bVar1 &&
               (bVar1 = ON_BinaryArchive::WriteString(archive,&this->m_angle_as_string), bVar1)))) {
      bVar1 = ON_BinaryArchive::WriteInt(archive,(uint)this->m_string_format);
    }
    else {
      bVar1 = false;
    }
    bVar2 = ON_BinaryArchive::EndWrite3dmChunk(archive);
    return (bool)(bVar2 & bVar1);
  }
  return false;
}

Assistant:

bool ON_AngleValue::Write(
  class ON_BinaryArchive& archive
) const
{
  const int content_version = 1;
  if (!archive.BeginWrite3dmAnonymousChunk(content_version))
    return false;

  bool rc = false;
  for (;;)
  {
    if (!archive.WriteDouble(m_angle))
      break;
    if (!archive.WriteInt(static_cast<unsigned int>(m_angle_unit_system)))
      break;
    if (!archive.WriteInt(static_cast<unsigned int>(m_context_length_unit_system)))
      break;
    if (!archive.WriteInt(m_context_locale_id))
      break;
    if (!archive.WriteString(m_angle_as_string))
      break;

    // content version 1 added m_string_format
    const unsigned int u = static_cast<unsigned char>(m_string_format);
    if (!archive.WriteInt(u))
      break;

    rc = true;
    break;
  }
  if (!archive.EndWrite3dmChunk())
    rc = false;
  return rc;
}